

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

void ncnn::convolution_gemm_transB_packed_tile_int8
               (Mat *AT_tile,Mat *BT_tile,Mat *topT_tile,int i,int max_ii,int j,int max_jj,int k,
               int max_kk)

{
  undefined4 in_ECX;
  Mat *in_RDX;
  Mat *in_RSI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  
  Gemm_x86_fma_utility::gemm_transB_packed_tile_int8
            (in_RSI,in_RDX,(Mat *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  return;
}

Assistant:

static void convolution_gemm_transB_packed_tile_int8(const Mat& AT_tile, const Mat& BT_tile, Mat& topT_tile, int i, int max_ii, int j, int max_jj, int k, int max_kk)
{
    // NCNN_LOGE("convolution_gemm_transB_packed_tile_int8 %d %d %d %d %d %d", i, max_ii, j, max_jj, k, max_kk);

#if NCNN_RUNTIME_CPU && __AVX512F__
    Gemm_x86_avx512_utility::gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
#elif NCNN_RUNTIME_CPU && __FMA__
    Gemm_x86_fma_utility::gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
#elif NCNN_RUNTIME_CPU && __AVX__
    Gemm_x86_avx_utility::gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
#else
    Gemm_x86_utility::gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
#endif
}